

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O3

void __thiscall LUPMatrix::LUPMatrix(LUPMatrix *this,ExtendedMatrix *system)

{
  Matrix *pMVar1;
  Permutation *row_permutation;
  Permutation *column_permutation;
  Matrix local_60;
  Matrix local_40;
  
  pMVar1 = ExtendedMatrix::GetExtensionMatrix(system);
  Matrix::GetInverse(&local_60,pMVar1,Without);
  pMVar1 = ExtendedMatrix::GetMainMatrix(system);
  local_40.n_ = pMVar1->n_;
  local_40.m_ = pMVar1->m_;
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&local_40.elements_,&pMVar1->elements_);
  row_permutation = ExtendedMatrix::GetRowPermutation(system);
  column_permutation = ExtendedMatrix::GetMainColumnPermutation(system);
  LUPMatrix(this,&local_60,&local_40,row_permutation,column_permutation);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_40.elements_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_60.elements_);
  return;
}

Assistant:

LUPMatrix::LUPMatrix(const ExtendedMatrix& system)
  : LUPMatrix(system.GetExtensionMatrix().GetInverse(Options::ChoiceType::Without), system.GetMainMatrix(),
              system.GetRowPermutation(), system.GetMainColumnPermutation()) {}